

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

int __thiscall SQLite::Statement::getColumnIndex(Statement *this,char *apName)

{
  iterator iVar1;
  sqlite3_stmt *pStmt;
  char *__s;
  mapped_type *pmVar2;
  Exception *this_00;
  int i;
  int N;
  long in_FS_OFFSET;
  allocator<char> local_59;
  key_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    for (N = 0; N < this->mColumnCount; N = N + 1) {
      pStmt = getPreparedStatement(this);
      __s = sqlite3_column_name(pStmt,N);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->mColumnNames,&local_58);
      *pmVar2 = N;
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,apName,&local_59);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->mColumnNames)._M_t,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mColumnNames)._M_t._M_impl.super__Rb_tree_header)
  {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,"Unknown column name.");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1._M_node[2]._M_color;
  }
  __stack_chk_fail();
}

Assistant:

int Statement::getColumnIndex(const char* apName) const
{
    // Build the map of column index by name on first call
    if (mColumnNames.empty())
    {
        for (int i = 0; i < mColumnCount; ++i)
        {
            const char* pName = sqlite3_column_name(getPreparedStatement(), i);
            mColumnNames[pName] = i;
        }
    }

    const auto iIndex = mColumnNames.find(apName);
    if (iIndex == mColumnNames.end())
    {
        throw SQLite::Exception("Unknown column name.");
    }

    return iIndex->second;
}